

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O2

Variant * Jinx::Impl::GetKey(Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  Variant *this;
  ScriptIPtr s;
  shared_ptr<Jinx::IScript> local_38;
  CollectionItrPair local_28;
  
  std::static_pointer_cast<Jinx::Impl::Script,Jinx::IScript>(&local_38);
  this = (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl.
         super__Vector_impl_data._M_start;
  if (this->m_type == CollectionItr) {
    Variant::GetCollectionItr(&local_28,this);
    Variant::Variant(__return_storage_ptr__,(Variant *)(local_28.first._M_node + 1));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.second.
                super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  else {
    Script::Error((Script *)
                  local_38.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  "\'get key\' called with non-iterator param");
    __return_storage_ptr__->m_type = Null;
    Variant::SetNull(__return_storage_ptr__);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant GetKey(ScriptPtr script, const Parameters & params)
	{
		ScriptIPtr s = std::static_pointer_cast<Script>(script);
		if (!params[0].IsCollectionItr())
		{
			s->Error("'get key' called with non-iterator param");
			return nullptr;
		}
		return params[0].GetCollectionItr().first->first;
	}